

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::testRunEnded(ConsoleReporter *this,TestRunStats *_testRunStats)

{
  ostream *this_00;
  ConsoleReporter *in_RSI;
  TestRunStats *in_RDI;
  Totals *in_stack_00000148;
  ConsoleReporter *in_stack_00000150;
  
  if ((in_RDI[4].field_0x49 & 1) != 0) {
    printTotalsDivider(in_RSI);
  }
  printTotals(in_stack_00000150,in_stack_00000148);
  this_00 = std::operator<<((ostream *)in_RDI[4].totals.assertions.passed,"\n");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  StreamingReporterBase::testRunEnded(&in_RSI->super_StreamingReporterBase,in_RDI);
  return;
}

Assistant:

virtual void testRunEnded( TestRunStats const& _testRunStats ) {
            if( m_atLeastOneTestCasePrinted )
                printTotalsDivider();
            printTotals( _testRunStats.totals );
            stream << "\n" << std::endl;
            StreamingReporterBase::testRunEnded( _testRunStats );
        }